

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O1

void __thiscall
OpenMD::RestraintForceModifier::~RestraintForceModifier(RestraintForceModifier *this)

{
  ~RestraintForceModifier(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

RestraintForceModifier::~RestraintForceModifier() {
    Utils::deletePointers(restraints_);

    delete restOut;
  }